

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::SplitBailOnResultCondition(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  Instr *instr_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36bb,"(instr)","instr");
    if (!bVar2) goto LAB_005a541c;
    *puVar4 = 0;
  }
  if (MDStart < instr->m_opcode) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x36bc,"(!instr->IsLowered())","!instr->IsLowered()");
    if (!bVar2) goto LAB_005a541c;
    *puVar4 = 0;
  }
  BVar3 = IR::Instr::GetBailOutKind(instr);
  if ((BVar3 & BailOutOnResultConditions) == BailOutInvalid) {
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if (BVar3 != BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x36bf,
                         "(instr->GetBailOutKind() & IR::BailOutOnResultConditions || instr->GetBailOutKind() == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                         ,
                         "instr->GetBailOutKind() & IR::BailOutOnResultConditions || instr->GetBailOutKind() == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                        );
      if (!bVar2) {
LAB_005a541c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  instr_00 = IR::Instr::New(instr->m_opcode,instr->m_func);
  IR::Instr::TransferTo(instr,instr_00);
  IR::Instr::InsertBefore(instr,instr_00);
  return instr_00;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnResultCondition(IR::Instr *const instr) const
{
    Assert(instr);
    Assert(!instr->IsLowered());
    Assert(
        instr->GetBailOutKind() & IR::BailOutOnResultConditions ||
        instr->GetBailOutKind() == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);

    const auto nonBailOutInstr = IR::Instr::New(instr->m_opcode, instr->m_func);
    instr->TransferTo(nonBailOutInstr);
    instr->InsertBefore(nonBailOutInstr);
    return nonBailOutInstr;
}